

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_13::NameResolver::ResolveVar
          (NameResolver *this,BindingHash *bindings,Var *var,char *desc)

{
  Index index;
  string *psVar1;
  
  if (var->type_ != Name) {
    return;
  }
  index = BindingHash::FindIndex(bindings,var);
  if (index != 0xffffffff) {
    Var::set_index(var,index);
    return;
  }
  psVar1 = Var::name_abi_cxx11_(var);
  PrintError(this,&var->loc,"undefined %s variable \"%s\"",desc,(psVar1->_M_dataplus)._M_p);
  return;
}

Assistant:

void NameResolver::ResolveVar(const BindingHash* bindings,
                              Var* var,
                              const char* desc) {
  if (var->is_name()) {
    Index index = bindings->FindIndex(*var);
    if (index == kInvalidIndex) {
      PrintError(&var->loc, "undefined %s variable \"%s\"", desc,
                 var->name().c_str());
      return;
    }

    var->set_index(index);
  }
}